

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi.c
# Opt level: O3

MPI_Request getMPIRequest(IceTCommRequest icet_request)

{
  MPI_Request poVar1;
  
  poVar1 = (MPI_Request)&ompi_request_null;
  if (icet_request != (IceTCommRequest)0x0) {
    if (icet_request->magic_number == 0xd7168b00) {
      poVar1 = *icet_request->internals;
    }
    else {
      icetRaiseDiagnostic("Request object is not from the MPI communicator.",0xfffffffa,1,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/communication/mpi.c"
                          ,99);
    }
  }
  return poVar1;
}

Assistant:

static MPI_Request getMPIRequest(IceTCommRequest icet_request)
{
    if (icet_request == ICET_COMM_REQUEST_NULL) {
        return MPI_REQUEST_NULL;
    }

    if (icet_request->magic_number != ICET_MPI_REQUEST_MAGIC_NUMBER) {
        icetRaiseError("Request object is not from the MPI communicator.",
                       ICET_INVALID_VALUE);
        return MPI_REQUEST_NULL;
    }

    return (((IceTMPICommRequestInternals)icet_request->internals)->request);
}